

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.cpp
# Opt level: O1

bool __thiscall Xml::Private::parseElement(Private *this,Element *element)

{
  String *this_00;
  usize *puVar1;
  Type TVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  Iterator this_01;
  Element *element_00;
  List<Xml::Variant> *this_02;
  ulong uVar7;
  String attributeName;
  Position pos;
  String local_c0;
  String local_98;
  HashMap<String,_String> *local_70;
  String *local_68;
  String *local_60;
  Variant local_58;
  
  element->line = (this->token).pos.line;
  element->column = (*(int *)&(this->token).pos.pos - *(int *)&(this->token).pos.lineStart) + 1;
  bVar4 = readToken(this);
  if (bVar4) {
    if ((this->token).type == nameType) {
      local_68 = &(this->token).value;
      String::operator=(&element->type,local_68);
      bVar4 = readToken(this);
      if (bVar4) {
        this_00 = &this->errorString;
        local_70 = &element->attributes;
        local_60 = &element->type;
        do {
          TVar2 = (this->token).type;
          if (TVar2 == nameType) {
            String::String(&local_c0,local_68);
            bVar5 = readToken(this);
            bVar4 = true;
            if (bVar5) {
              if ((this->token).type == equalsSignType) {
                bVar5 = readToken(this);
                if (bVar5) {
                  if ((this->token).type != stringType) {
                    local_98._data.ref = 0;
                    local_98._data.str = "Expected string";
                    local_98._data.len = 0xf;
                    iVar3 = *(int *)&(this->token).pos.pos;
                    this->errorLine = (this->token).pos.line;
                    this->errorColumn = (iVar3 - *(int *)&(this->token).pos.lineStart) + 1;
                    local_98.data = &local_98._data;
                    String::operator=(this_00,&local_98);
                    goto LAB_001085f9;
                  }
                  HashMap<String,_String>::insert(local_70,&local_70->_end,&local_c0,local_68);
                  bVar4 = false;
                }
              }
              else {
                local_98._data.ref = 0;
                local_98._data.str = "Expected \'=\'";
                local_98._data.len = 0xc;
                iVar3 = *(int *)&(this->token).pos.pos;
                this->errorLine = (this->token).pos.line;
                this->errorColumn = (iVar3 - *(int *)&(this->token).pos.lineStart) + 1;
                local_98.data = &local_98._data;
                String::operator=(this_00,&local_98);
LAB_001085f9:
                if ((local_98.data)->ref != 0) {
                  LOCK();
                  puVar1 = &(local_98.data)->ref;
                  *puVar1 = *puVar1 - 1;
                  UNLOCK();
                  if ((*puVar1 == 0) && (local_98.data != (Data *)0x0)) {
                    operator_delete__(local_98.data);
                  }
                }
              }
            }
            if ((local_c0.data)->ref != 0) {
              LOCK();
              puVar1 = &(local_c0.data)->ref;
              *puVar1 = *puVar1 - 1;
              UNLOCK();
              if ((*puVar1 == 0) && (local_c0.data != (Data *)0x0)) {
                operator_delete__(local_c0.data);
              }
            }
            if (bVar4) {
              return false;
            }
          }
          else {
            if (TVar2 == tagEndType) {
              this_02 = &element->content;
              local_98._data.len = (usize)(this->pos).lineStart;
              local_98.data = *(Data **)&this->pos;
              local_98._data.str = (this->pos).pos;
              local_70 = (HashMap<String,_String> *)this_00;
              bVar4 = readToken(this);
              if (bVar4) {
                TVar2 = (this->token).type;
                if (TVar2 == endTagBeginType) {
                  uVar7 = 4;
                  goto LAB_00108861;
                }
                if (TVar2 == startTagBeginType) {
                  local_c0.data = (Data *)&Variant::nullData;
                  this_01 = List<Xml::Variant>::insert(this_02,&this_02->_end,(Variant *)&local_c0);
                  Variant::clear((Variant *)&local_c0);
                  element_00 = Variant::toElement(&(this_01.item)->value);
                  bVar4 = parseElement(this,element_00);
                  uVar6 = (*(code *)((long)&DAT_0010d7fc +
                                    (long)(int)(&DAT_0010d7fc)[(uint)bVar4 * 4 + 1]))();
                  return (bool)uVar6;
                }
                (this->pos).lineStart = (char *)local_98._data.len;
                *(Data **)&this->pos = local_98.data;
                (this->pos).pos = local_98._data.str;
              }
              local_c0.data = &String::emptyData.super_Data;
              bVar4 = parseText(this,&local_c0);
              if (bVar4) {
                local_58.data = (Data *)operator_new__(0x38);
                String::String((String *)(local_58.data + 1),&local_c0);
                (local_58.data)->type = textType;
                (local_58.data)->ref = 1;
                List<Xml::Variant>::insert(this_02,&this_02->_end,&local_58);
                Variant::clear(&local_58);
              }
              uVar7 = (ulong)!bVar4;
              if ((local_c0.data)->ref != 0) {
                LOCK();
                puVar1 = &(local_c0.data)->ref;
                *puVar1 = *puVar1 - 1;
                UNLOCK();
                if ((*puVar1 == 0) && (local_c0.data != (Data *)0x0)) {
                  operator_delete__(local_c0.data);
                }
              }
LAB_00108861:
              uVar6 = (*(code *)((long)&DAT_0010d7fc + (long)(int)(&DAT_0010d7fc)[uVar7]))();
              return (bool)uVar6;
            }
            if (TVar2 == emptyTagEndType) {
              return true;
            }
          }
          bVar4 = readToken(this);
        } while (bVar4);
      }
    }
    else {
      local_c0.data = &local_c0._data;
      local_c0._data.ref = 0;
      local_c0._data.str = "Expected tag name";
      local_c0._data.len = 0x11;
      iVar3 = *(int *)&(this->token).pos.pos;
      this->errorLine = (this->token).pos.line;
      this->errorColumn = (iVar3 - *(int *)&(this->token).pos.lineStart) + 1;
      String::operator=(&this->errorString,&local_c0);
      if ((local_c0.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_c0.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (local_c0.data != (Data *)0x0)) {
          operator_delete__(local_c0.data);
        }
      }
    }
  }
  return false;
}

Assistant:

bool Xml::Private::parseElement(Element& element)
{
  element.line = token.pos.line;
  element.column = (int)(token.pos.pos - token.pos.lineStart) + 1;
  if(!readToken())
    return false;
  if(token.type != Token::nameType)
    return syntaxError(token.pos, "Expected tag name"), false;
  element.type = token.value;
  for(;;)
  {
    if(!readToken())
      return false;
    if(token.type == Token::emptyTagEndType)
      return true;
    if(token.type == Token::tagEndType)
      break;
    if(token.type == Token::nameType)
    {
      String attributeName = token.value;
      if(!readToken())
        return false;
      if(token.type != Token::equalsSignType)
        return syntaxError(token.pos, "Expected '='"), false;
      if(!readToken())
        return false;
      if(token.type != Token::stringType)
        return syntaxError(token.pos, "Expected string"), false;
      element.attributes.append(attributeName, token.value);
      continue;
    }
  }
  for(;;)
  {
    Position pos = this->pos;
    if(readToken())
    {
      if(token.type == Token::endTagBeginType)
        break;
      if(token.type == Token::startTagBeginType)
      {
        Variant& variant = element.content.append(Variant());
        if(!parseElement(variant.toElement()))
          return false;
        continue;
      }
      else
        this->pos = pos;
    }
    String string;
    if(!parseText(string))
      return false;
    element.content.append(string);
  }
  if(!readToken())
    return false;
  if(token.type != Token::nameType)
    return syntaxError(token.pos, "Expected tag name"), false;
  if(token.value != element.type)
    return syntaxError(token.pos, String("Expected end tag of '") + element.type + ("'")), false;
  if(!readToken())
    return false;
  if(token.type != Token::tagEndType)
    return syntaxError(token.pos, "Expected '>'"), false;
  return true;
}